

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

void __thiscall
wasm::
SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
::insert(SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
         *this,HeapType *x)

{
  bool bVar1;
  InsertResult IVar2;
  iterator __first;
  iterator pvVar3;
  HeapType *x_local;
  SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
  *this_local;
  
  bVar1 = usingFixed(this);
  if (bVar1) {
    IVar2 = UnorderedFixedStorage<wasm::HeapType,_5UL>::insert(&this->fixed,x);
    if (IVar2 == CouldNotInsert) {
      if ((this->fixed).super_FixedStorageBase<wasm::HeapType,_5UL>.used != 5) {
        __assert_fail("fixed.used == N",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xa7,
                      "void wasm::SmallSetBase<wasm::HeapType, 5, wasm::UnorderedFixedStorage<wasm::HeapType, 5>, std::unordered_set<wasm::HeapType>>::insert(const T &) [T = wasm::HeapType, N = 5, FixedStorage = wasm::UnorderedFixedStorage<wasm::HeapType, 5>, FlexibleSet = std::unordered_set<wasm::HeapType>]"
                     );
      }
      bVar1 = std::
              unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
              ::empty(&this->flexible);
      if (!bVar1) {
        __assert_fail("flexible.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xa8,
                      "void wasm::SmallSetBase<wasm::HeapType, 5, wasm::UnorderedFixedStorage<wasm::HeapType, 5>, std::unordered_set<wasm::HeapType>>::insert(const T &) [T = wasm::HeapType, N = 5, FixedStorage = wasm::UnorderedFixedStorage<wasm::HeapType, 5>, FlexibleSet = std::unordered_set<wasm::HeapType>]"
                     );
      }
      __first = std::array<wasm::HeapType,_5UL>::begin
                          (&(this->fixed).super_FixedStorageBase<wasm::HeapType,_5UL>.storage);
      pvVar3 = std::array<wasm::HeapType,_5UL>::begin
                         (&(this->fixed).super_FixedStorageBase<wasm::HeapType,_5UL>.storage);
      std::
      unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>
      ::insert<wasm::HeapType*>
                ((unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>
                  *)&this->flexible,__first,
                 pvVar3 + (this->fixed).super_FixedStorageBase<wasm::HeapType,_5UL>.used);
      std::
      unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
      ::insert(&this->flexible,x);
      bVar1 = usingFixed(this);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!usingFixed()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xac,
                      "void wasm::SmallSetBase<wasm::HeapType, 5, wasm::UnorderedFixedStorage<wasm::HeapType, 5>, std::unordered_set<wasm::HeapType>>::insert(const T &) [T = wasm::HeapType, N = 5, FixedStorage = wasm::UnorderedFixedStorage<wasm::HeapType, 5>, FlexibleSet = std::unordered_set<wasm::HeapType>]"
                     );
      }
      (this->fixed).super_FixedStorageBase<wasm::HeapType,_5UL>.used = 0;
    }
  }
  else {
    std::
    unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
    ::insert(&this->flexible,x);
  }
  return;
}

Assistant:

void insert(const T& x) {
    if (usingFixed()) {
      if (fixed.insert(x) == FixedStorage::InsertResult::CouldNotInsert) {
        // We need to add an item but no fixed storage remains to grow. Switch
        // to flexible.
        assert(fixed.used == N);
        assert(flexible.empty());
        flexible.insert(fixed.storage.begin(),
                        fixed.storage.begin() + fixed.used);
        flexible.insert(x);
        assert(!usingFixed());
        fixed.used = 0;
      }
    } else {
      flexible.insert(x);
    }
  }